

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O2

void check_leash(xchar x,xchar y)

{
  int *piVar1;
  xchar x_00;
  xchar y_00;
  boolean bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  monst *mtmp;
  obj **ppoVar7;
  
  ppoVar7 = &invent;
LAB_001409ed:
  do {
    do {
      do {
        do {
          ppoVar7 = &((obj *)ppoVar7)->nobj->nobj;
          if ((obj *)ppoVar7 == (obj *)0x0) {
            return;
          }
        } while ((((obj *)ppoVar7)->otyp != 0xf1) || (((obj *)ppoVar7)->corpsenm == 0));
        mtmp = (monst *)&level->monlist;
        do {
          mtmp = mtmp->nmon;
          if (mtmp == (monst *)0x0) {
            impossible("leash in use isn\'t attached to anything?");
            ((obj *)ppoVar7)->corpsenm = 0;
            goto LAB_001409ed;
          }
        } while ((mtmp->mhp < 1) || (mtmp->m_id != ((obj *)ppoVar7)->corpsenm));
        iVar3 = dist2((int)u.ux,(int)u.uy,(int)mtmp->mx,(int)mtmp->my);
        iVar4 = dist2((int)CONCAT71(in_register_00000039,x),(int)CONCAT71(in_register_00000031,y),
                      (int)mtmp->mx,(int)mtmp->my);
      } while (iVar3 <= iVar4);
      x_00 = mtmp->mx;
      y_00 = mtmp->my;
      bVar2 = um_dist(x_00,y_00,'\x03');
    } while (bVar2 == '\0');
    if (((((obj *)ppoVar7)->field_0x4a & 1) != 0) && ((mtmp->data->mflags1 & 0x400) == 0)) {
      bVar2 = um_dist(x_00,y_00,'\x05');
      if (bVar2 == '\0') {
        iVar4 = rnd(2);
        piVar1 = &mtmp->mhp;
        iVar3 = *piVar1;
        *piVar1 = *piVar1 - iVar4;
        if (*piVar1 != 0 && SBORROW4(iVar3,iVar4) == *piVar1 < 0) {
          pcVar6 = Monnam(mtmp);
          pline("%s chokes on the leash!",pcVar6);
          if (mtmp->mtame != '\0') {
            iVar3 = rn2((int)mtmp->mtame);
            if (iVar3 != 0) {
              mtmp->mtame = mtmp->mtame + -1;
            }
          }
          goto LAB_001409ed;
        }
      }
      uVar5 = u.uconduct.killer;
      mon_nam(mtmp);
      pline("Your leash chokes %s to death!");
      xkilled(mtmp,0);
      if (0 < mtmp->mhp) {
        u.uconduct.killer = uVar5;
      }
      goto LAB_001409ed;
    }
    bVar2 = um_dist(x_00,y_00,'\x05');
    if (bVar2 == '\0') {
      pline("You pull on the leash.");
      if (mtmp->data->msound != '\0') {
        uVar5 = mt_random();
        if (uVar5 % 3 == 1) {
          yelp(mtmp);
        }
        else if (uVar5 % 3 == 0) {
          growl(mtmp);
        }
        else {
          whimper(mtmp);
        }
      }
    }
    else {
      pcVar6 = Monnam(mtmp);
      s_suffix(pcVar6);
      pline("%s leash snaps loose!");
      m_unleash(mtmp,'\0');
    }
  } while( true );
}

Assistant:

void check_leash(xchar x, xchar y)
{
	struct obj *otmp;
	struct monst *mtmp;

	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    if (otmp->otyp != LEASH || otmp->leashmon == 0) continue;
	    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
		if (DEADMONSTER(mtmp)) continue;
		if ((int)mtmp->m_id == otmp->leashmon) break; 
	    }
	    if (!mtmp) {
		impossible("leash in use isn't attached to anything?");
		otmp->leashmon = 0;
		continue;
	    }
	    if (dist2(u.ux,u.uy,mtmp->mx,mtmp->my) >
		    dist2(x,y,mtmp->mx,mtmp->my)) {
		if (!um_dist(mtmp->mx, mtmp->my, 3)) {
		    ;	/* still close enough */
		} else if (otmp->cursed && !breathless(mtmp->data)) {
		    if (um_dist(mtmp->mx, mtmp->my, 5) ||
			    (mtmp->mhp -= rnd(2)) <= 0) {
			long save_pacifism = u.uconduct.killer;

			pline("Your leash chokes %s to death!", mon_nam(mtmp));
			/* hero might not have intended to kill pet, but
			   that's the result of his actions; gain experience,
			   lose pacifism, take alignment and luck hit, make
			   corpse less likely to remain tame after revival */
			xkilled(mtmp, 0);	/* no "you kill it" message */
			/* life-saving doesn't ordinarily reset this */
			if (mtmp->mhp > 0) u.uconduct.killer = save_pacifism;
		    } else {
			pline("%s chokes on the leash!", Monnam(mtmp));
			/* tameness eventually drops to 1 here (never 0) */
			if (mtmp->mtame && rn2(mtmp->mtame)) mtmp->mtame--;
		    }
		} else {
		    if (um_dist(mtmp->mx, mtmp->my, 5)) {
			pline("%s leash snaps loose!", s_suffix(Monnam(mtmp)));
			m_unleash(mtmp, FALSE);
		    } else {
			pline("You pull on the leash.");
			if (mtmp->data->msound != MS_SILENT)
			    switch (rn2(3)) {
			    case 0:  growl(mtmp);   break;
			    case 1:  yelp(mtmp);    break;
			    default: whimper(mtmp); break;
			    }
		    }
		}
	    }
	}
}